

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_control_mobile_impl.cc
# Opt level: O2

int __thiscall webrtc::EchoControlMobileImpl::Enable(EchoControlMobileImpl *this,bool enable)

{
  int sample_rate_hz;
  StreamProperties *pSVar1;
  ostream *poVar2;
  int iVar3;
  CritScope cs_capture;
  CritScope cs_render;
  FatalMessage local_188;
  
  rtc::CritScope::CritScope(&cs_render,this->crit_render_);
  rtc::CritScope::CritScope(&cs_capture,this->crit_capture_);
  pSVar1 = (this->stream_properties_)._M_t.
           super___uniq_ptr_impl<webrtc::EchoControlMobileImpl::StreamProperties,_std::default_delete<webrtc::EchoControlMobileImpl::StreamProperties>_>
           ._M_t.
           super__Tuple_impl<0UL,_webrtc::EchoControlMobileImpl::StreamProperties_*,_std::default_delete<webrtc::EchoControlMobileImpl::StreamProperties>_>
           .super__Head_base<0UL,_webrtc::EchoControlMobileImpl::StreamProperties_*,_false>.
           _M_head_impl;
  if (pSVar1 == (StreamProperties *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/echo_control_mobile_impl.cc"
               ,0x104);
    poVar2 = std::operator<<((ostream *)&local_188,"Check failed: stream_properties_");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<(poVar2,"# ");
    rtc::FatalMessage::~FatalMessage(&local_188);
  }
  if (enable) {
    sample_rate_hz = pSVar1->sample_rate_hz;
    if (16000 < sample_rate_hz) {
      iVar3 = -7;
      goto LAB_0017eb3c;
    }
    if (this->enabled_ == false) {
      this->enabled_ = enable;
      iVar3 = 0;
      Initialize(this,sample_rate_hz,pSVar1->num_reverse_channels,pSVar1->num_output_channels);
      goto LAB_0017eb3c;
    }
  }
  this->enabled_ = enable;
  iVar3 = 0;
LAB_0017eb3c:
  rtc::CritScope::~CritScope(&cs_capture);
  rtc::CritScope::~CritScope(&cs_render);
  return iVar3;
}

Assistant:

int EchoControlMobileImpl::Enable(bool enable) {
  // Ensure AEC and AECM are not both enabled.
  rtc::CritScope cs_render(crit_render_);
  rtc::CritScope cs_capture(crit_capture_);
  RTC_DCHECK(stream_properties_);

  if (enable &&
      stream_properties_->sample_rate_hz > AudioProcessing::kSampleRate16kHz) {
    return AudioProcessing::kBadSampleRateError;
  }

  if (enable && !enabled_) {
    enabled_ = enable;  // Must be set before Initialize() is called.

    // TODO(peah): Simplify once the Enable function has been removed from
    // the public APM API.
    Initialize(stream_properties_->sample_rate_hz,
               stream_properties_->num_reverse_channels,
               stream_properties_->num_output_channels);
  } else {
    enabled_ = enable;
  }
  return AudioProcessing::kNoError;
}